

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

int tdefl_flush_block(tdefl_compressor *d,int flush)

{
  mz_uint8 *pmVar1;
  tdefl_put_buf_func_ptr p_Var2;
  mz_bool mVar3;
  uint uVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  mz_uint mVar9;
  ulong uVar10;
  mz_uint mVar11;
  int iVar12;
  mz_uint8 *pmVar13;
  bool bVar14;
  bool bVar15;
  
  if ((d->m_flags & 0x80000) == 0) {
    bVar14 = false;
  }
  else {
    bVar14 = d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size;
  }
  if ((d->m_pPut_buf_func == (tdefl_put_buf_func_ptr)0x0) &&
     (0x14ccb < *d->m_pOut_buf_size - d->m_out_buf_ofs)) {
    pmVar13 = (mz_uint8 *)(d->m_out_buf_ofs + (long)d->m_pOut_buf);
  }
  else {
    pmVar13 = d->m_output_buf;
  }
  d->m_pOutput_buf = pmVar13;
  d->m_pOutput_buf_end = pmVar13 + 0x14cbc;
  if (d->m_output_flush_remaining != 0) {
    __assert_fail("!d->m_output_flush_remaining",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                  ,0xb13,"int tdefl_flush_block(tdefl_compressor *, int)");
  }
  d->m_output_flush_ofs = 0;
  *d->m_pLZ_flags = *d->m_pLZ_flags >> ((byte)d->m_num_flags_left & 0x1f);
  d->m_pLZ_code_buf = d->m_pLZ_code_buf + -(ulong)(d->m_num_flags_left == 8);
  if (((d->m_flags & 0x1000) != 0) && (d->m_block_index == 0)) {
    uVar7 = 0x78 << (d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = uVar7;
    for (uVar4 = d->m_bits_in + 8; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)uVar7;
        uVar4 = d->m_bits_in;
        uVar7 = d->m_bit_buffer;
      }
      uVar7 = uVar7 >> 8;
      d->m_bit_buffer = uVar7;
    }
    uVar7 = uVar7 | 1 << (uVar4 & 0x1f);
    d->m_bit_buffer = uVar7;
    for (uVar4 = uVar4 | 8; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
      pmVar1 = d->m_pOutput_buf;
      if (pmVar1 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar1 + 1;
        *pmVar1 = (mz_uint8)uVar7;
        uVar4 = d->m_bits_in;
        uVar7 = d->m_bit_buffer;
      }
      uVar7 = uVar7 >> 8;
      d->m_bit_buffer = uVar7;
    }
  }
  mVar11 = (uint)(flush == 4) << (d->m_bits_in & 0x1f) | d->m_bit_buffer;
  mVar9 = d->m_bits_in + 1;
  d->m_bit_buffer = mVar11;
  while( true ) {
    d->m_bits_in = mVar9;
    pmVar1 = d->m_pOutput_buf;
    if (mVar9 < 8) break;
    if (pmVar1 < d->m_pOutput_buf_end) {
      d->m_pOutput_buf = pmVar1 + 1;
      *pmVar1 = (mz_uint8)mVar11;
      mVar9 = d->m_bits_in;
      mVar11 = d->m_bit_buffer;
    }
    mVar11 = mVar11 >> 8;
    mVar9 = mVar9 - 8;
    d->m_bit_buffer = mVar11;
  }
  bVar15 = true;
  if (bVar14) {
LAB_00127a56:
    if (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos <= d->m_dict_size) {
      d->m_pOutput_buf = pmVar1;
      d->m_bit_buffer = mVar11;
      for (mVar9 = mVar9 + 2; d->m_bits_in = mVar9, 7 < mVar9; mVar9 = mVar9 - 8) {
        pmVar1 = d->m_pOutput_buf;
        if (pmVar1 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar1 + 1;
          *pmVar1 = (mz_uint8)mVar11;
          mVar9 = d->m_bits_in;
          mVar11 = d->m_bit_buffer;
        }
        mVar11 = mVar11 >> 8;
        d->m_bit_buffer = mVar11;
      }
      if (mVar9 == 0) {
        uVar4 = 0;
      }
      else {
        for (uVar4 = 8; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)mVar11;
            uVar4 = d->m_bits_in;
            mVar11 = d->m_bit_buffer;
          }
          mVar11 = mVar11 >> 8;
          d->m_bit_buffer = mVar11;
        }
      }
      iVar12 = 2;
      while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
        mVar11 = mVar11 | (uint)(ushort)d->m_total_lz_bytes << (uVar4 & 0x1f);
        d->m_bit_buffer = mVar11;
        for (uVar4 = uVar4 + 0x10; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)mVar11;
            uVar4 = d->m_bits_in;
            mVar11 = d->m_bit_buffer;
          }
          mVar11 = mVar11 >> 8;
          d->m_bit_buffer = mVar11;
        }
        d->m_total_lz_bytes = d->m_total_lz_bytes ^ 0xffff;
      }
      for (uVar7 = 0; uVar7 < d->m_total_lz_bytes; uVar7 = uVar7 + 1) {
        mVar11 = mVar11 | (uint)d->m_dict[d->m_lz_code_buf_dict_pos + uVar7 & 0x7fff] <<
                          (uVar4 & 0x1f);
        d->m_bit_buffer = mVar11;
        for (uVar4 = uVar4 + 8; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)mVar11;
            uVar4 = d->m_bits_in;
            mVar11 = d->m_bit_buffer;
          }
          mVar11 = mVar11 >> 8;
          d->m_bit_buffer = mVar11;
        }
      }
      goto LAB_00127a7c;
    }
  }
  else {
    if ((d->m_flags & 0x40000) == 0) {
      uVar4 = (uint)(d->m_total_lz_bytes < 0x30);
    }
    else {
      uVar4 = 1;
    }
    mVar3 = tdefl_compress_block(d,uVar4);
    bVar15 = mVar3 == 0;
    if (((ulong)d->m_total_lz_bytes != 0) &&
       ((long)(ulong)d->m_total_lz_bytes <= (long)(d->m_pOutput_buf + (1 - (long)pmVar1))))
    goto LAB_00127a56;
  }
  if (bVar15) {
    d->m_pOutput_buf = pmVar1;
    d->m_bit_buffer = mVar11;
    d->m_bits_in = mVar9;
    tdefl_compress_block(d,1);
  }
LAB_00127a7c:
  if (flush != 0) {
    if (flush == 4) {
      if (d->m_bits_in == 0) {
        uVar4 = 0;
      }
      else {
        for (uVar4 = 8; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
          pmVar1 = d->m_pOutput_buf;
          uVar7 = d->m_bit_buffer;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)uVar7;
            uVar4 = d->m_bits_in;
            uVar7 = d->m_bit_buffer;
          }
          d->m_bit_buffer = uVar7 >> 8;
        }
      }
      if ((d->m_flags & 0x1000) != 0) {
        uVar7 = d->m_adler32;
        for (iVar12 = 0; iVar12 != 4; iVar12 = iVar12 + 1) {
          uVar8 = (uVar7 >> 0x18) << (uVar4 & 0x1f) | d->m_bit_buffer;
          d->m_bit_buffer = uVar8;
          for (uVar4 = uVar4 + 8; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
            pmVar1 = d->m_pOutput_buf;
            if (pmVar1 < d->m_pOutput_buf_end) {
              d->m_pOutput_buf = pmVar1 + 1;
              *pmVar1 = (mz_uint8)uVar8;
              uVar4 = d->m_bits_in;
              uVar8 = d->m_bit_buffer;
            }
            uVar8 = uVar8 >> 8;
            d->m_bit_buffer = uVar8;
          }
          uVar7 = uVar7 << 8;
        }
      }
    }
    else {
      uVar7 = 8;
      iVar12 = 2;
      for (uVar4 = d->m_bits_in + 3; d->m_bits_in = uVar4, 7 < uVar4; uVar4 = uVar4 - 8) {
        pmVar1 = d->m_pOutput_buf;
        uVar8 = d->m_bit_buffer;
        if (pmVar1 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar1 + 1;
          *pmVar1 = (mz_uint8)uVar8;
          uVar4 = d->m_bits_in;
          uVar8 = d->m_bit_buffer;
        }
        d->m_bit_buffer = uVar8 >> 8;
      }
      uVar6 = 0;
      uVar8 = 0;
      if (uVar4 != 0) {
        for (; d->m_bits_in = uVar7, uVar6 = 0, uVar8 = uVar7, 7 < uVar7; uVar7 = uVar7 - 8) {
          pmVar1 = d->m_pOutput_buf;
          uVar4 = d->m_bit_buffer;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)uVar4;
            uVar7 = d->m_bits_in;
            uVar4 = d->m_bit_buffer;
          }
          d->m_bit_buffer = uVar4 >> 8;
        }
      }
      while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
        uVar4 = (uint)uVar6 << (uVar8 & 0x1f) | d->m_bit_buffer;
        d->m_bit_buffer = uVar4;
        for (uVar8 = uVar8 + 0x10; d->m_bits_in = uVar8, 7 < uVar8; uVar8 = uVar8 - 8) {
          pmVar1 = d->m_pOutput_buf;
          if (pmVar1 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar1 + 1;
            *pmVar1 = (mz_uint8)uVar4;
            uVar8 = d->m_bits_in;
            uVar4 = d->m_bit_buffer;
          }
          uVar4 = uVar4 >> 8;
          d->m_bit_buffer = uVar4;
        }
        uVar6 = uVar6 ^ 0xffff;
      }
    }
  }
  pmVar1 = d->m_pOutput_buf;
  if (pmVar1 < d->m_pOutput_buf_end) {
    memset(d->m_huff_count,0,0x280);
    d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
    d->m_pLZ_flags = d->m_lz_code_buf;
    iVar12 = (int)pmVar1 - (int)pmVar13;
    mVar11 = d->m_total_lz_bytes;
    d->m_num_flags_left = 8;
    d->m_total_lz_bytes = 0;
    d->m_lz_code_buf_dict_pos = d->m_lz_code_buf_dict_pos + mVar11;
    d->m_block_index = d->m_block_index + 1;
    if (iVar12 != 0) {
      p_Var2 = d->m_pPut_buf_func;
      if (p_Var2 == (tdefl_put_buf_func_ptr)0x0) {
        uVar5 = (ulong)iVar12;
        if (pmVar13 == d->m_output_buf) {
          uVar10 = *d->m_pOut_buf_size - d->m_out_buf_ofs;
          if (uVar5 < uVar10) {
            uVar10 = uVar5;
          }
          mVar11 = (mz_uint)uVar10;
          memcpy((void *)(d->m_out_buf_ofs + (long)d->m_pOut_buf),d->m_output_buf,(long)(int)mVar11)
          ;
          d->m_out_buf_ofs = d->m_out_buf_ofs + (long)(int)mVar11;
          if (iVar12 - mVar11 != 0) {
            d->m_output_flush_ofs = mVar11;
            d->m_output_flush_remaining = iVar12 - mVar11;
          }
        }
        else {
          d->m_out_buf_ofs = d->m_out_buf_ofs + uVar5;
        }
      }
      else {
        *d->m_pIn_buf_size = (long)d->m_pSrc - (long)d->m_pIn_buf;
        mVar3 = (*p_Var2)(d->m_output_buf,iVar12,d->m_pPut_buf_user);
        if (mVar3 == 0) {
          d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED;
          return -1;
        }
      }
    }
    return d->m_output_flush_remaining;
  }
  __assert_fail("d->m_pOutput_buf < d->m_pOutput_buf_end",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/cpp/src/../../Zippy/library/Zippy/miniz/miniz.h"
                ,0xb5c,"int tdefl_flush_block(tdefl_compressor *, int)");
}

Assistant:

static int tdefl_flush_block(tdefl_compressor* d, int flush) {

    mz_uint saved_bit_buf, saved_bits_in;
    mz_uint8* pSaved_output_buf;
    mz_bool comp_block_succeeded = MZ_FALSE;
    int n, use_raw_block = ((d->m_flags & TDEFL_FORCE_ALL_RAW_BLOCKS) != 0)
            && (d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size;
    mz_uint8* pOutput_buf_start = ((d->m_pPut_buf_func == NULL)
            && ((*d->m_pOut_buf_size - d->m_out_buf_ofs) >= TDEFL_OUT_BUF_SIZE)) ? ((mz_uint8*)d->m_pOut_buf
            + d->m_out_buf_ofs) : d->m_output_buf;

    d->m_pOutput_buf = pOutput_buf_start;
    d->m_pOutput_buf_end = d->m_pOutput_buf + TDEFL_OUT_BUF_SIZE - 16;

    MZ_ASSERT(!d->m_output_flush_remaining);
    d->m_output_flush_ofs = 0;
    d->m_output_flush_remaining = 0;

    *d->m_pLZ_flags = (mz_uint8)(*d->m_pLZ_flags >> d->m_num_flags_left);
    d->m_pLZ_code_buf -= (d->m_num_flags_left == 8);

    if ((d->m_flags & TDEFL_WRITE_ZLIB_HEADER) && (!d->m_block_index)) {
        TDEFL_PUT_BITS(0x78, 8);
        TDEFL_PUT_BITS(0x01, 8);
    }

    TDEFL_PUT_BITS(flush == TDEFL_FINISH, 1);

    pSaved_output_buf = d->m_pOutput_buf;
    saved_bit_buf = d->m_bit_buffer;
    saved_bits_in = d->m_bits_in;

    if (!use_raw_block)
        comp_block_succeeded = tdefl_compress_block(d,
                                                    (d->m_flags & TDEFL_FORCE_ALL_STATIC_BLOCKS)
                                                            || (d->m_total_lz_bytes < 48));

    /* If the block gets expanded, forget the current contents of the output buffer and send a raw block instead. */
    if (((use_raw_block)
            || ((d->m_total_lz_bytes) && ((d->m_pOutput_buf - pSaved_output_buf + 1U) >= d->m_total_lz_bytes)))
            && ((d->m_lookahead_pos - d->m_lz_code_buf_dict_pos) <= d->m_dict_size)) {
        mz_uint i;
        d->m_pOutput_buf = pSaved_output_buf;
        d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
        TDEFL_PUT_BITS(0, 2);
        if (d->m_bits_in) {
            TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
        }
        for (i = 2; i; --i, d->m_total_lz_bytes ^= 0xFFFF) {
            TDEFL_PUT_BITS(d->m_total_lz_bytes & 0xFFFF, 16);
        }
        for (i = 0; i < d->m_total_lz_bytes; ++i) {
            TDEFL_PUT_BITS(d->m_dict[(d->m_lz_code_buf_dict_pos + i) & TDEFL_LZ_DICT_SIZE_MASK], 8);
        }
    }
        /* Check for the extremely unlikely (if not impossible) case of the compressed block not fitting into the output buffer when using dynamic codes. */
    else if (!comp_block_succeeded) {
        d->m_pOutput_buf = pSaved_output_buf;
        d->m_bit_buffer = saved_bit_buf, d->m_bits_in = saved_bits_in;
        tdefl_compress_block(d, MZ_TRUE);
    }

    if (flush) {
        if (flush == TDEFL_FINISH) {
            if (d->m_bits_in) {
                TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
            }
            if (d->m_flags & TDEFL_WRITE_ZLIB_HEADER) {
                mz_uint i, a = d->m_adler32;
                for (i = 0; i < 4; i++) {
                    TDEFL_PUT_BITS((a >> 24) & 0xFF, 8);
                    a <<= 8;
                }
            }
        }
        else {
            mz_uint i, z = 0;
            TDEFL_PUT_BITS(0, 3);
            if (d->m_bits_in) {
                TDEFL_PUT_BITS(0, 8 - d->m_bits_in);
            }
            for (i = 2; i; --i, z ^= 0xFFFF) {
                TDEFL_PUT_BITS(z & 0xFFFF, 16);
            }
        }
    }

    MZ_ASSERT(d->m_pOutput_buf < d->m_pOutput_buf_end);

    memset(&d->m_huff_count[0][0], 0, sizeof(d->m_huff_count[0][0]) * TDEFL_MAX_HUFF_SYMBOLS_0);
    memset(&d->m_huff_count[1][0], 0, sizeof(d->m_huff_count[1][0]) * TDEFL_MAX_HUFF_SYMBOLS_1);

    d->m_pLZ_code_buf = d->m_lz_code_buf + 1;
    d->m_pLZ_flags = d->m_lz_code_buf;
    d->m_num_flags_left = 8;
    d->m_lz_code_buf_dict_pos += d->m_total_lz_bytes;
    d->m_total_lz_bytes = 0;
    d->m_block_index++;

    if ((n = (int)(d->m_pOutput_buf - pOutput_buf_start)) != 0) {
        if (d->m_pPut_buf_func) {
            *d->m_pIn_buf_size = d->m_pSrc - (const mz_uint8*)d->m_pIn_buf;
            if (!(*d->m_pPut_buf_func)(d->m_output_buf, n, d->m_pPut_buf_user))
                return (d->m_prev_return_status = TDEFL_STATUS_PUT_BUF_FAILED);
        }
        else if (pOutput_buf_start == d->m_output_buf) {
            int bytes_to_copy = (int)MZ_MIN((size_t)n, (size_t)(*d->m_pOut_buf_size - d->m_out_buf_ofs));
            memcpy((mz_uint8*)d->m_pOut_buf + d->m_out_buf_ofs, d->m_output_buf, bytes_to_copy);
            d->m_out_buf_ofs += bytes_to_copy;
            if ((n -= bytes_to_copy) != 0) {
                d->m_output_flush_ofs = bytes_to_copy;
                d->m_output_flush_remaining = n;
            }
        }
        else {
            d->m_out_buf_ofs += n;
        }
    }

    return d->m_output_flush_remaining;
}